

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void writePic<PicHeaderPS3>(ostream *stream,PicHeader *header,istream *reference)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicHeaderPS3 t;
  undefined8 local_40;
  undefined1 local_38 [4];
  uint32_t local_34;
  undefined8 local_30;
  int local_24;
  
  std::istream::seekg((long)reference,_S_beg);
  std::istream::read((char *)reference,(long)local_38);
  local_34 = header->filesize;
  local_30._0_2_ = header->ew;
  local_30._2_2_ = header->eh;
  local_30._4_2_ = header->width;
  local_30._6_2_ = header->height;
  local_24 = (int)((ulong)((long)(header->chunks).
                                 super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(header->chunks).
                                super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  std::ostream::write((char *)stream,(long)local_38);
  pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    do {
      local_40._0_2_ = pPVar2->x;
      local_40._2_2_ = pPVar2->y;
      local_40._4_4_ = pPVar2->offset;
      std::ostream::write((char *)stream,(long)&local_40);
      pPVar2 = pPVar2 + 1;
    } while (pPVar2 != pPVar1);
  }
  return;
}

Assistant:

void writePic(std::ostream& stream, const PicHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.filesize = header.filesize;
	h.ew = header.ew;
	h.eh = header.eh;
	h.width = header.width;
	h.height = header.height;
	h.chunks = header.chunks.size();
	writeRaw(stream, h);
	copyBytes(stream, reference, h.bytesToSkip());
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c(chunk.x, chunk.y, chunk.offset, chunk.size);
		writeRaw(stream, c);
	}
}